

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O2

void __thiscall tl::StrT<char32_t>::resizeNoCopy(StrT<char32_t> *this,u32 size)

{
  char32_t *pcVar1;
  char32_t *pcVar2;
  
  if (size != 0) {
    pcVar1 = growIfNeeded(this,size);
    pcVar2 = this->_str;
    if (pcVar1 != (char32_t *)0x0) {
      if (pcVar2 != (char32_t *)0x0 && pcVar2 != &s_emptyStr<char32_t>) {
        operator_delete__(pcVar2);
      }
      this->_str = pcVar1;
      pcVar2 = pcVar1;
    }
    this->_size = size;
    pcVar2[size] = L'\0';
  }
  return;
}

Assistant:

void StrT<CharT>::resizeNoCopy(u32 size)
{
    if(size == 0)
        return;
    if(auto str = growIfNeeded(size)) {
        if(_str != s_emptyStr<CharT>) {
            delete[] _str;
        }
        _str = str;
    }
    _size = size;
    _str[size] = 0;
}